

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O3

StackSym * __thiscall IR::ArrayRegOpnd::LengthSym(ArrayRegOpnd *this)

{
  ValueType *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  this_00 = &(this->super_RegOpnd).super_Opnd.m_valueType;
  bVar2 = ValueType::IsLikelyTypedArray(this_00);
  if (bVar2) {
    bVar2 = ValueType::IsOptimizedTypedArray(this_00);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.h"
                         ,0x5bf,
                         "(!(m_valueType.IsLikelyTypedArray() && !m_valueType.IsOptimizedTypedArray()))"
                         ,
                         "!(m_valueType.IsLikelyTypedArray() && !m_valueType.IsOptimizedTypedArray())"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  bVar2 = ValueType::IsLikelyTypedArray(this_00);
  return (&this->headSegmentLengthSym)[!bVar2];
}

Assistant:

StackSym *LengthSym() const
    {
        // For typed arrays, the head segment length is the same as the array length
        Assert(!(m_valueType.IsLikelyTypedArray() && !m_valueType.IsOptimizedTypedArray()));
        return m_valueType.IsLikelyTypedArray() ? HeadSegmentLengthSym() : lengthSym;
    }